

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneST.cpp
# Opt level: O3

void __thiscall
PermutazioneST::randomBS
          (PermutazioneST *this,PermutazioneST *p,uint limiteTrasposizioni,unsigned_short *risultato
          )

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  unsigned_short *puVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  ushort uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  bool bVar12;
  PermutazioneST pCopia;
  uniform_int_distribution<int> local_58;
  unsigned_short *local_50;
  Permutazione local_48;
  
  local_50 = risultato;
  Permutazione::Permutazione
            (&local_48,(p->super_Permutazione).individuo,(p->super_Permutazione).dimensione);
  local_48._vptr_Permutazione = (_func_int **)&PTR__Permutazione_0010dce0;
  uVar1 = (p->super_Permutazione).dimensione;
  pvVar6 = operator_new__(-(ulong)(uVar1 == 0) | (ulong)uVar1 * 2 - 2);
  if (1 < uVar1) {
    puVar4 = (p->super_Permutazione).individuo;
    uVar9 = 0;
    uVar10 = 0;
    do {
      if (puVar4[uVar9 + 1] < puVar4[uVar9]) {
        uVar11 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        *(short *)((long)pvVar6 + uVar11 * 2) = (short)uVar9;
      }
      uVar9 = uVar9 + 1;
    } while (uVar1 - 1 != uVar9);
    if (limiteTrasposizioni != 0 && uVar10 != 0) {
      uVar9 = 1;
      do {
        local_58._M_param._M_b = uVar10 - 1;
        local_58._M_param._M_a = 0;
        uVar5 = std::uniform_int_distribution<int>::operator()
                          (&local_58,&genRand.gen,&local_58._M_param);
        uVar1 = *(ushort *)((long)pvVar6 + (ulong)(uVar5 & 0xffff) * 2);
        uVar7 = uVar1 + 1;
        uVar8 = uVar10 - 1;
        local_50[uVar9 - 1] = uVar1;
        uVar2 = local_48.individuo[uVar1];
        uVar3 = local_48.individuo[uVar7];
        local_48.individuo[uVar1] = uVar3;
        local_48.individuo[uVar7] = uVar2;
        *(undefined2 *)((long)pvVar6 + (ulong)(uVar5 & 0xffff) * 2) =
             *(undefined2 *)((long)pvVar6 + (ulong)uVar8 * 2);
        if (uVar1 != 0) {
          uVar5 = uVar1 - 1;
          if ((uVar3 < local_48.individuo[uVar5]) && (local_48.individuo[uVar5] < uVar2)) {
            *(short *)((long)pvVar6 + (ulong)uVar8 * 2) = (short)uVar5;
            uVar8 = uVar10;
          }
        }
        uVar10 = uVar8;
        if (((uVar1 + 2 < (uint)(p->super_Permutazione).dimensione) &&
            (local_48.individuo[(ulong)uVar1 + 2] < uVar2)) &&
           (uVar3 < local_48.individuo[(ulong)uVar1 + 2])) {
          *(short *)((long)pvVar6 + (ulong)uVar8 * 2) = (short)uVar7;
          uVar10 = uVar8 + 1;
        }
      } while ((uVar10 != 0) && (bVar12 = uVar9 < limiteTrasposizioni, uVar9 = uVar9 + 1, bVar12));
    }
  }
  operator_delete__(pvVar6);
  Permutazione::~Permutazione(&local_48);
  return;
}

Assistant:

void PermutazioneST::randomBS(PermutazioneST& p, unsigned int limiteTrasposizioni, unsigned short* risultato) {

	PermutazioneST pCopia(p.individuo, p.dimensione);

	unsigned short* zeta = new unsigned short[p.dimensione - 1];
	unsigned short cursoreZeta = 0;

	unsigned int cursoreTrasposizioni = 0;
	unsigned int contatoreTrasposizioni = 0;

	for (unsigned short i = 0; i < p.dimensione - 1; i++) {
		if (p.individuo[i] > p.individuo[i + 1])
			zeta[cursoreZeta++] = i;
	}

	unsigned short random, randomZeta, temp;

	while (cursoreZeta > 0 && contatoreTrasposizioni < limiteTrasposizioni) {

		random = genRand.randIntU(0, cursoreZeta - 1);
		randomZeta = zeta[random];

		risultato[contatoreTrasposizioni++] = randomZeta;


		temp = pCopia.individuo[randomZeta];
		pCopia.individuo[randomZeta] = pCopia.individuo[randomZeta + 1];
		pCopia.individuo[randomZeta + 1] = temp;

		zeta[random] = zeta[--cursoreZeta];

		if (randomZeta > 0 && pCopia.individuo[randomZeta - 1] > pCopia.individuo[randomZeta] &&
			pCopia.individuo[randomZeta - 1] < pCopia.individuo[randomZeta + 1])
			zeta[cursoreZeta++] = randomZeta - 1;

		if (randomZeta + 2 < p.dimensione && pCopia.individuo[randomZeta + 1] > pCopia.individuo[randomZeta + 2] &&
			pCopia.individuo[randomZeta] < pCopia.individuo[randomZeta + 2])
			zeta[cursoreZeta++] = randomZeta + 1;

	}

	delete[] zeta;
}